

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
::on_replacement_field
          (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,char *p)

{
  size_t *psVar1;
  char *pcVar2;
  undefined8 in_RDX;
  type tVar3;
  size_t local_30;
  char local_28;
  void *local_20;
  undefined8 local_18;
  basic_format_context<fmt::v5::internal::counting_iterator<char>,_char> *local_10;
  
  pcVar2 = (this->context).
           super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
           .parse_context_.format_str_.data_;
  (this->context).
  super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
  .parse_context_.format_str_.data_ = p;
  psVar1 = &(this->context).
            super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
            .parse_context_.format_str_.size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)p));
  local_10 = &this->context;
  if ((this->arg).type_ == custom_type) {
    (*(this->arg).value_.field_0.custom.format)((this->arg).value_.field_0.pointer,local_10);
    return;
  }
  local_30 = (this->context).
             super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
             .out_.count_;
  local_28 = (this->context).
             super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
             .out_.blackhole_;
  local_20 = (this->context).
             super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
             .loc_.locale_;
  local_18 = 0;
  tVar3 = visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
                    ((v5 *)&local_30,
                     (arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                      *)&this->arg,
                     (basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                      *)CONCAT71((int7)((ulong)in_RDX >> 8),local_28));
  (this->context).
  super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
  .out_.count_ = tVar3.count_;
  (this->context).
  super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
  .out_.blackhole_ = tVar3.blackhole_;
  return;
}

Assistant:

void on_replacement_field(const Char *p) {
    context.parse_context().advance_to(p);
    internal::custom_formatter<Char, Context> f(context);
    if (!visit_format_arg(f, arg))
      context.advance_to(visit_format_arg(ArgFormatter(context), arg));
  }